

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypeEmbeddedFontWriter.cpp
# Opt level: O3

EStatusCode __thiscall TrueTypeEmbeddedFontWriter::WriteHead(TrueTypeEmbeddedFontWriter *this)

{
  OutputStringBufferStream *this_00;
  TrueTypePrimitiveWriter *this_01;
  EStatusCode EVar1;
  TableEntry *pTVar2;
  LongFilePositionType inTableOffset;
  IByteReaderWithPosition *pIVar3;
  IByteReader *inInputStream;
  LongFilePositionType inOffsetFromStart;
  OutputStreamTraits streamCopier;
  OutputStreamTraits OStack_38;
  
  pTVar2 = OpenTypeFileInput::GetTableEntry(&this->mTrueTypeInput,"head");
  if (pTVar2 == (TableEntry *)0x0) {
    EVar1 = eFailure;
  }
  else {
    this_00 = &this->mFontFileStream;
    OutputStreamTraits::OutputStreamTraits(&OStack_38,(IByteWriter *)this_00);
    inTableOffset = OutputStringBufferStream::GetCurrentPosition(this_00);
    pIVar3 = InputFile::GetInputStream(&this->mTrueTypeFile);
    (*(pIVar3->super_IByteReader)._vptr_IByteReader[4])(pIVar3,pTVar2->Offset);
    inInputStream = &InputFile::GetInputStream(&this->mTrueTypeFile)->super_IByteReader;
    OutputStreamTraits::CopyToOutputStream(&OStack_38,inInputStream,pTVar2->Length);
    this_01 = &this->mPrimitivesWriter;
    TrueTypePrimitiveWriter::PadTo4(this_01);
    inOffsetFromStart = OutputStringBufferStream::GetCurrentPosition(this_00);
    this->mHeadCheckSumOffset = inTableOffset + 8;
    OutputStringBufferStream::SetPosition(this_00,inTableOffset + 8);
    TrueTypePrimitiveWriter::WriteULONG(this_01,0);
    OutputStringBufferStream::SetPosition(this_00,inTableOffset + 0x32);
    TrueTypePrimitiveWriter::WriteUSHORT(this_01,1);
    WriteTableEntryData(this,this->mHEADEntryWritingOffset,inTableOffset,pTVar2->Length);
    OutputStringBufferStream::SetPosition(this_00,inOffsetFromStart);
    EVar1 = TrueTypePrimitiveWriter::GetInternalState(this_01);
    OutputStreamTraits::~OutputStreamTraits(&OStack_38);
  }
  return EVar1;
}

Assistant:

EStatusCode TrueTypeEmbeddedFontWriter::WriteHead()
{
	// copy as is, then adjust loca table format to long (that's what i'm always writing), 
	// set the checksum
	// and store the offset to the checksum

	TableEntry* tableEntry = mTrueTypeInput.GetTableEntry("head");
	if (!tableEntry) {
		return PDFHummus::eFailure;
	}
	LongFilePositionType startTableOffset;
	OutputStreamTraits streamCopier(&mFontFileStream);
	LongFilePositionType endOfStream;

	startTableOffset = mFontFileStream.GetCurrentPosition();

	// copy and save the current position
	mTrueTypeFile.GetInputStream()->SetPosition(tableEntry->Offset);
	streamCopier.CopyToOutputStream(mTrueTypeFile.GetInputStream(),tableEntry->Length);
	mPrimitivesWriter.PadTo4();
	endOfStream = mFontFileStream.GetCurrentPosition();

	// set the checksum to 0, and save its position for later update
	mHeadCheckSumOffset = startTableOffset + 8;
	mFontFileStream.SetPosition(mHeadCheckSumOffset);
	mPrimitivesWriter.WriteULONG(0);

	// set the loca format to longs
	mFontFileStream.SetPosition(startTableOffset + 50);
	mPrimitivesWriter.WriteUSHORT(1);

	// write table entry data, which includes movement
	WriteTableEntryData(mHEADEntryWritingOffset,startTableOffset,tableEntry->Length);

	// restore position to end of stream
	mFontFileStream.SetPosition(endOfStream); 

	return mPrimitivesWriter.GetInternalState();
}